

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.hpp
# Opt level: O2

void pstore::command_line::details::report_unknown_option<std::ostream>
               (string *program_name,string *arg_name,
               maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
               *value,basic_ostream<char,_std::char_traits<char>_> *errs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  allocator local_41;
  string local_40;
  
  if (value->valid_ == true) {
    pbVar1 = maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
             ::operator->(value);
    std::__cxx11::string::string((string *)&local_40,(string *)pbVar1);
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"",&local_41);
  }
  report_unknown_option<std::ostream>(program_name,arg_name,&local_40,errs);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void report_unknown_option (std::string const & program_name,
                                        std::string const & arg_name,
                                        maybe<std::string> const & value, ErrorStream & errs) {
                report_unknown_option (program_name, arg_name, value ? *value : "", errs);
            }